

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.cc
# Opt level: O2

void __thiscall trng::mt19937_64::mt19937_64(mt19937_64 *this,unsigned_long s)

{
  (this->S).mti = 0;
  memset((this->S).mt,0,0x9c0);
  seed(this,s);
  return;
}

Assistant:

mt19937_64::mt19937_64(unsigned long s) { seed(s); }